

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableInit *curr)

{
  ExternalInterface *pEVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  Literal *pLVar6;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  Name NVar11;
  Flow local_198;
  undefined1 local_150 [8];
  Flow dest;
  Flow offset;
  Flow size;
  Literal value;
  undefined1 local_58 [8];
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_150,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->dest);
  if (dest.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&dest.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
    if (offset.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&offset.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
      if (size.breakTo.super_IString.str._M_len == 0) {
        NVar11.super_IString.str._M_str = (char *)(curr->segment).super_IString.str._M_len;
        NVar11.super_IString.str._M_len = (size_t)this->wasm;
        info.name.super_IString.str._M_str = (char *)wasm::Module::getElementSegment(NVar11);
        Flow::getSingleValue((Flow *)local_150);
        lVar5 = wasm::Literal::getUnsigned();
        pLVar6 = Flow::getSingleValue((Flow *)&dest.breakTo.super_IString.str._M_str);
        uVar3 = Literal::geti32(pLVar6);
        pLVar6 = Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
        uVar4 = Literal::geti32(pLVar6);
        uVar9 = (ulong)uVar3;
        uVar8 = (ulong)uVar4;
        if (uVar9 + uVar8 != 0) {
          sVar7 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&(this->droppedElementSegments)._M_h,&curr->segment);
          if (sVar7 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in table.init");
          }
        }
        if ((ulong)(*(long *)(info.name.super_IString.str._M_str + 0x40) -
                    *(long *)(info.name.super_IString.str._M_str + 0x38) >> 3) < uVar9 + uVar8) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in table.init");
        }
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_58,this,(Name)(curr->table).super_IString.str);
        pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_58)->externalInterface;
        uVar3 = (*pEVar1->_vptr_ExternalInterface[0x1b])
                          (pEVar1,info.instance,info.name.super_IString.str._M_len);
        pcVar2 = info.name.super_IString.str._M_str;
        if ((ulong)uVar3 < lVar5 + uVar8) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds table access in table.init");
        }
        while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
          ExpressionRunner<wasm::ModuleRunner>::visit
                    (&local_198,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                     *(Expression **)(*(long *)(pcVar2 + 0x38) + uVar9 * 8));
          pLVar6 = Flow::getSingleValue(&local_198);
          wasm::Literal::Literal((Literal *)&size.breakTo.super_IString.str._M_str,pLVar6);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)&local_198);
          pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_58)->externalInterface;
          (*pEVar1->_vptr_ExternalInterface[0x1c])
                    (pEVar1,info.instance,info.name.super_IString.str._M_len,lVar5,
                     &size.breakTo.super_IString.str._M_str);
          wasm::Literal::~Literal((Literal *)&size.breakTo.super_IString.str._M_str);
          uVar9 = uVar9 + 1;
          lVar5 = lVar5 + 1;
        }
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&dest.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&dest.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_150);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_150);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableInit(TableInit* curr) {
    NOTE_ENTER("TableInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getElementSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(uint32_t(offset.getSingleValue().geti32()));
    Address sizeVal(uint32_t(size.getSingleValue().geti32()));

    if (offsetVal + sizeVal > 0 &&
        droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in table.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in table.init");
    }
    auto info = getTableInstanceInfo(curr->table);
    auto tableSize = info.interface()->tableSize(info.name);
    if (destVal + sizeVal > tableSize) {
      trap("out of bounds table access in table.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      // FIXME: We should not call visit() here more than once at runtime. The
      //        values in the segment should be computed once during startup,
      //        and then read here as needed. For example, if we had a
      //        struct.new here then we should not allocate a new struct each
      //        time we table.init that data.
      auto value = self()->visit(segment->data[offsetVal + i]).getSingleValue();
      info.interface()->tableStore(info.name, destVal + i, value);
    }
    return {};
  }